

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

string * __thiscall google::protobuf::internal::LazyString::Init_abi_cxx11_(LazyString *this)

{
  char *pcVar1;
  uint uVar2;
  string *psVar3;
  undefined8 *puVar4;
  LazyString *pLVar5;
  
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)&Init::mu);
  if (uVar2 == 0) {
    pLVar5 = (LazyString *)(this->inited_)._M_b._M_p;
    if (pLVar5 == (LazyString *)0x0) {
      pcVar1 = (this->field_0).init_value_.ptr;
      (this->field_0).init_value_.ptr = (char *)((long)&this->field_0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)this,pcVar1,pcVar1 + (this->field_0).init_value_.size);
      (this->inited_)._M_b._M_p = (__pointer_type)this;
      pLVar5 = this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&Init::mu);
    return (string *)pLVar5;
  }
  puVar4 = (undefined8 *)(ulong)uVar2;
  std::__throw_system_error(uVar2);
  psVar3 = (string *)operator_new(0x20);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar3->_M_string_length = 0;
  (psVar3->field_2)._M_local_buf[0] = '\0';
  *puVar4 = psVar3;
  return psVar3;
}

Assistant:

const std::string& LazyString::Init() const {
  static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
  mu.Lock();
  const std::string* res = inited_.load(std::memory_order_acquire);
  if (res == nullptr) {
    auto init_value = init_value_;
    res = ::new (static_cast<void*>(string_buf_))
        std::string(init_value.ptr, init_value.size);
    inited_.store(res, std::memory_order_release);
  }
  mu.Unlock();
  return *res;
}